

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::setEditable(QComboBox *this,bool editable)

{
  long lVar1;
  QComboBoxPrivate *this_00;
  bool bVar2;
  int iVar3;
  QStyle *pQVar4;
  QComboBoxPrivateContainer *pQVar5;
  QAbstractScrollArea *pQVar6;
  QWidget *this_01;
  QPalette *palette;
  QComboBoxPrivate *d;
  long in_FS_OFFSET;
  QStyleOptionComboBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->lineEdit != (QLineEdit *)0x0) != editable) {
    memset(&opt,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox(&opt);
    (**(code **)(*(long *)&this->super_QWidget + 0x1b8))(this,&opt);
    pQVar4 = QWidget::style(&this->super_QWidget);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x19,&opt,this,0);
    if (editable) {
      if (iVar3 != 0) {
        pQVar5 = QComboBoxPrivate::viewContainer(this_00);
        QComboBoxPrivateContainer::updateScrollers(pQVar5);
        pQVar6 = (QAbstractScrollArea *)view(this);
        QAbstractScrollArea::setVerticalScrollBarPolicy(pQVar6,ScrollBarAsNeeded);
      }
      this_01 = (QWidget *)operator_new(0x28);
      QLineEdit::QLineEdit((QLineEdit *)this_01,&this->super_QWidget);
      palette = QWidget::palette(&this->super_QWidget);
      QWidget::setPalette(this_01,palette);
      setLineEdit(this,(QLineEdit *)this_01);
    }
    else {
      if (iVar3 != 0) {
        pQVar5 = QComboBoxPrivate::viewContainer(this_00);
        QComboBoxPrivateContainer::updateScrollers(pQVar5);
        pQVar6 = (QAbstractScrollArea *)view(this);
        QAbstractScrollArea::setVerticalScrollBarPolicy(pQVar6,ScrollBarAlwaysOff);
      }
      QWidget::setAttribute(&this->super_QWidget,WA_InputMethodEnabled,false);
      QWidget::hide(&this_00->lineEdit->super_QWidget);
      QObject::deleteLater();
      this_00->lineEdit = (QLineEdit *)0x0;
    }
    QComboBoxPrivate::updateDelegate(this_00,false);
    pQVar5 = QComboBoxPrivate::viewContainer(this_00);
    QComboBoxPrivateContainer::updateTopBottomMargin(pQVar5);
    bVar2 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Resized);
    if (!bVar2) {
      QWidget::adjustSize(&this->super_QWidget);
    }
    QStyleOptionComboBox::~QStyleOptionComboBox(&opt);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setEditable(bool editable)
{
    Q_D(QComboBox);
    if (isEditable() == editable)
        return;

    QStyleOptionComboBox opt;
    initStyleOption(&opt);
    if (editable) {
        if (style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, this)) {
            d->viewContainer()->updateScrollers();
            view()->setVerticalScrollBarPolicy(Qt::ScrollBarAsNeeded);
        }
        QLineEdit *le = new QLineEdit(this);
        le->setPalette(palette());
        setLineEdit(le);
    } else {
        if (style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, this)) {
            d->viewContainer()->updateScrollers();
            view()->setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
        }
        setAttribute(Qt::WA_InputMethodEnabled, false);
        d->lineEdit->hide();
        d->lineEdit->deleteLater();
        d->lineEdit = nullptr;
    }

    d->updateDelegate();
    d->updateFocusPolicy();

    d->viewContainer()->updateTopBottomMargin();
    if (!testAttribute(Qt::WA_Resized))
        adjustSize();
}